

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations2Points1Line<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *P1,Matrix<float,_4,_1,_0,_4,_1> *P2
          ,Matrix<float,_4,_1,_0,_4,_1> *P1_B,Matrix<float,_4,_1,_0,_4,_1> *P2_B)

{
  DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *this;
  MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *other;
  Scalar *pSVar1;
  RealScalar RVar2;
  RealScalar RVar3;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0> local_688;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0> local_678;
  undefined1 local_668 [8];
  Matrix<float,_4,_4,_0,_4,_4> TP_B;
  undefined1 local_618 [8];
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> local_5d0 [56];
  non_const_type local_598;
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> local_590 [60];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_554 [12];
  non_const_type local_548;
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> local_540 [56];
  non_const_type local_508;
  Matrix<float,_3,_1,_0,_3,_1> local_500;
  Matrix<float,_3,_1,_0,_3,_1> local_4f4;
  Matrix<float,_3,_1,_0,_3,_1> local_4e8;
  Matrix<float,_3,_1,_0,_3,_1> local_4dc;
  Type local_4d0;
  PlainObject local_498;
  Type local_470;
  non_const_type local_438;
  Type local_430;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_3f4 [12];
  non_const_type local_3e8;
  Type local_3e0;
  non_const_type local_3a8;
  Matrix<float,_3,_1,_0,_3,_1> local_3a0;
  Matrix<float,_3,_1,_0,_3,_1> local_394;
  Matrix<float,_3,_1,_0,_3,_1> local_388;
  Matrix<float,_3,_1,_0,_3,_1> local_37c;
  Type local_370;
  PlainObject local_338;
  undefined1 local_314 [8];
  Matrix<float,_3,_1,_0,_3,_1> t2;
  Matrix<float,_3,_1,_0,_3,_1> t1;
  Matrix<float,_3,_1,_0,_3,_1> v1_;
  Matrix<float,_3,_1,_0,_3,_1> v1;
  Matrix<float,_3,_1,_0,_3,_1> v3;
  Matrix<float,_4,_4,_0,_4,_4> transV_B;
  Matrix<float,_4,_4,_0,_4,_4> transV;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0> local_248;
  undefined1 local_238 [8];
  Matrix<float,_4,_1,_0,_4,_1> P2_B1;
  Matrix<float,_4,_1,_0,_4,_1> P2_1;
  Type local_1e0;
  NegativeReturnType local_1a8;
  Type local_168;
  Type local_130;
  NegativeReturnType local_f8;
  undefined1 local_b8 [8];
  Matrix<float,_4,_4,_0,_4,_4> transU_B;
  Matrix<float,_4,_4,_0,_4,_4> transU;
  Matrix<float,_4,_1,_0,_4,_1> *P2_B_local;
  Matrix<float,_4,_1,_0,_4,_1> *P1_B_local;
  Matrix<float,_4,_1,_0,_4,_1> *P2_local;
  Matrix<float,_4,_1,_0,_4,_1> *P1_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe));
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_b8);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),4,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_130,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::operator-
            (&local_f8,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_130);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_168,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_168,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_f8);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_b8,4,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_1e0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1_B,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::operator-
            (&local_1a8,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_1e0);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)(P2_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array + 2),(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_b8,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
             (P2_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_1a8);
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
            ((Matrix<float,_4,_1,_0,_4,_1> *)
             (P2_B1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)local_238);
  local_248 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                         (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xe),
                         (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P2);
  Eigen::Matrix<float,4,1,0,4,1>::operator=
            ((Matrix<float,4,1,0,4,1> *)
             (P2_B1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
              *)&local_248);
  join_0x00000010_0x00000000_ =
       Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                 ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_b8,
                  (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P2_B);
  Eigen::Matrix<float,4,1,0,4,1>::operator=
            ((Matrix<float,4,1,0,4,1> *)local_238,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
              *)(transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
                 .array + 0xe));
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe));
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),4,4);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
             (v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),4,4);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_314);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                      (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 1),0);
  *pSVar1 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_314);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_314,1);
  *pSVar1 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_370,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
             (P2_B1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2),3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            (&local_338,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_370);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Matrix<float,__1,_1,_0,_4,_1>_> *)&local_338);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_37c,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),&local_37c);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_388,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_314);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),&local_388);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  if (RVar2 < RVar3) {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_3a0);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_3a0);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_394);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_394);
  }
  local_3a8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                         (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_3e0,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_3e0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_3a8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_3f4,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  local_3e8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_3f4);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<int,int>
            (&local_430,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),1,0,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_430,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_3e8);
  local_438 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                         (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<int,int>
            (&local_470,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),2,0,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_470,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_438);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_4d0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_238,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            (&local_498,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_4d0);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Matrix<float,__1,_1,_0,_4,_1>_> *)&local_498);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_4dc,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),&local_4dc);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_4e8,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_314);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),&local_4e8);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  if (RVar2 < RVar3) {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_500);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_500);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_4f4);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_4f4);
  }
  local_508 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                         (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1));
  this = (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
         (v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1)
  ;
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)local_540,this,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            (local_540,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_508);
  other = (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
          (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1
          );
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_554,other);
  local_548 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_554);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<int,int>((Type *)local_590,this,1,0,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            (local_590,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_548);
  local_598 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<int,int>((Type *)local_5d0,this,2,0,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            (local_5d0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_598);
  TP.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]._3_1_ =
       0;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_618);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_668);
  local_678 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                         (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xe),
                         (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                         (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xe));
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)local_618,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
              *)&local_678);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_618);
  local_688 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                         (v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1),
                         (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_b8);
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)local_668,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
              *)&local_688);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_668);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations2Points1Line(Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P2, Matrix<floatPrec, 4,1> P1_B, Matrix<floatPrec, 4,1> P2_B)
{

	// translate frames to P1 and P1_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> P2_1, P2_B1;
	P2_1 = transU * P2;
	P2_B1 = transU_B * P2_B;

	// align Z axis to the direction of P1 -> P2
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = P2_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = P2_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}